

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

Object * __thiscall pstack::Elf::Object::getDebug(Object *this)

{
  long *plVar1;
  ProgramHeaders **ppPVar2;
  string *name;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Context *pCVar4;
  element_type *peVar5;
  long lVar6;
  long lVar7;
  element_type *peVar8;
  pointer puVar9;
  _Base_ptr p_Var10;
  undefined1 auVar11 [8];
  undefined1 auVar12 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  pointer this_00;
  char cVar15;
  int iVar16;
  int iVar17;
  unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_> *sect;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Section *pSVar18;
  Section *pSVar19;
  ostream *poVar20;
  pointer puVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  _Rb_tree_node_base *p_Var23;
  anon_struct_56_8_fb3e104e *sect_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  _Base_ptr p_Var25;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *things;
  Object *pOVar26;
  long lVar27;
  ulong uVar28;
  undefined1 local_2b0 [8];
  ostringstream dir;
  undefined8 local_2a0;
  uint auStack_298 [22];
  ios_base local_240 [112];
  char acStack_1d0 [152];
  undefined1 local_138 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  undefined1 local_128 [8];
  iterator __begin2;
  iterator __end2;
  unique_ptr<debuginfod_client,_pstack::Context::DidClose> uStack_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_98;
  pointer local_80;
  csptr io;
  undefined1 auStack_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buildID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  if ((this->debugLoaded != false) || ((this->context->options).noExtDebug == true)) {
    return (this->debugObject).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  }
  this->debugLoaded = true;
  auStack_68 = (undefined1  [8])0x0;
  buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Notes::iterator::iterator((iterator *)local_128,this,true);
  Notes::iterator::iterator
            ((iterator *)
             &__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this,false);
  io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  do {
    if (((__begin2.object == __end2.object) && (__begin2.phdrs == __end2.phdrs)) &&
       (__begin2.phdrsi._M_current == __end2.phdrsi._M_current)) goto LAB_0015c39b;
    Notes::iterator::operator*
              ((NoteDesc *)
               &buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(iterator *)local_128);
    (**(code **)(*(long *)__str._M_string_length + 0x38))
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
               __str._M_string_length,0xc);
    iVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     "GNU");
    iVar17 = (int)__str._M_dataplus._M_p;
    if (iVar16 == 0) {
      if (local_2b0 != (undefined1  [8])&stack0xfffffffffffffd60) {
        operator_delete((void *)local_2b0,local_2a0 + 1);
      }
      this = (Object *)
             io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      if (iVar17 == 3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,".build-id/",10);
        NoteDesc::data((NoteDesc *)&local_80);
        iVar17 = (**(_func_int **)((long)(local_80->first)._M_dataplus._M_p + 0x40))();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_68,
                   CONCAT44(extraout_var,iVar17));
        auVar11 = auStack_68;
        this_00 = local_80;
        iVar17 = (**(_func_int **)((long)(local_80->first)._M_dataplus._M_p + 0x40))(local_80);
        Reader::readObj<unsigned_char>
                  ((Reader *)this_00,0,(uchar *)auVar11,CONCAT44(extraout_var_00,iVar17));
        *(uint *)((long)auStack_298 + *(long *)((long)local_2b0 + -0x18)) =
             *(uint *)((long)auStack_298 + *(long *)((long)local_2b0 + -0x18)) & 0xffffffb5 | 8;
        *(undefined8 *)((long)auStack_298 + *(long *)((long)local_2b0 + -0x18) + -8) = 2;
        lVar27 = *(long *)((long)local_2b0 + -0x18);
        if (acStack_1d0[lVar27 + 1] == '\0') {
          cVar15 = std::ios::widen((char)local_2b0 + (char)lVar27);
          acStack_1d0[lVar27] = cVar15;
          acStack_1d0[lVar27 + 1] = '\x01';
        }
        acStack_1d0[lVar27] = '0';
        std::ostream::operator<<(local_2b0,(uint)*(byte *)(_func_int ***)auStack_68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"/",1);
        for (uVar28 = 1;
            iVar17 = (**(_func_int **)((long)(local_80->first)._M_dataplus._M_p + 0x40))(),
            uVar28 < CONCAT44(extraout_var_01,iVar17); uVar28 = uVar28 + 1) {
          *(undefined8 *)((long)auStack_298 + *(long *)((long)local_2b0 + -0x18) + -8) = 2;
          std::ostream::operator<<
                    (local_2b0,(uint)*(byte *)((long)(_func_int ***)auStack_68 + uVar28));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,".debug",6);
        *(uint *)((long)auStack_298 + *(long *)((long)local_2b0 + -0x18)) =
             *(uint *)((long)auStack_298 + *(long *)((long)local_2b0 + -0x18)) & 0xffffffb5 | 2;
        name = *(string **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)this + 0x50))->_M_use_count
        ;
        std::__cxx11::stringbuf::str();
        Context::getDebugImage((Context *)local_138,name);
        p_Var13 = p_Stack_130;
        auVar11 = local_138;
        local_138 = (undefined1  [8])0x0;
        auVar12 = local_138;
        p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)this + 0x150))->
                 _vptr__Sp_counted_base;
        local_138._0_4_ = auVar11._0_4_;
        local_138._4_4_ = auVar11._4_4_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)[0x14]._M_use_count = local_138._0_4_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)[0x14]._M_weak_count = local_138._4_4_
        ;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)this + 0x150))->
        _vptr__Sp_counted_base = (_func_int **)p_Var13;
        local_138 = auVar12;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
        }
        if (__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != &local_98) {
          operator_delete(__end2.io.
                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,(long)local_98._vptr__Sp_counted_base + 1);
        }
        if (io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
        std::ios_base::~ios_base(local_240);
        if (__str.field_2._M_allocated_capacity != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     __str.field_2._M_allocated_capacity);
        }
LAB_0015c39b:
        if (__end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     __end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        if (__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     __begin2.io.
                     super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if ((this->debugObject).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          local_2b0 = (undefined1  [8])&stack0xfffffffffffffd60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,".gnu_debuglink","");
          pSVar18 = getSection(this,(string *)local_2b0,1);
          if (local_2b0 != (undefined1  [8])&stack0xfffffffffffffd60) {
            operator_delete((void *)local_2b0,local_2a0 + 1);
          }
          if ((pSVar18->shdr).sh_type != 0) {
            Section::io((Section *)local_128);
            (*(code *)(((((enable_shared_from_this<pstack::Elf::Object> *)local_128)->_M_weak_this).
                        super___weak_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      dynamic)._M_t._M_impl.super__Rb_tree_header._M_node_count)
                      (local_2b0,local_128,0);
            things = extraout_RDX;
            if (__begin2.object != (Object *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__begin2.object);
              things = extraout_RDX_00;
            }
            pCVar4 = this->context;
            stringify<pstack::Reader_const&>
                      ((string *)
                       &__begin2.io.
                        super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       (pstack *)
                       (this->io).
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       things);
            Context::dirname((Context *)local_128,(char *)pCVar4);
            ppPVar2 = &__end2.phdrs;
            if (__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppPVar2) {
              operator_delete(__begin2.io.
                              super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,
                              (ulong)((long)&((__end2.phdrs)->
                                             super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            pCVar4 = this->context;
            buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_128,
                       ((__begin2.object)->elfHeader).e_ident +
                       (long)&((Object *)((long)local_128 + -0x178))->programHeaders);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,"/");
            pbVar22 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&buildID.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (char *)local_2b0,_dir);
            __begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pbVar22->_M_dataplus)._M_p;
            paVar24 = &pbVar22->field_2;
            if (__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar24) {
              __end2.phdrs = (ProgramHeaders *)paVar24->_M_allocated_capacity;
              __end2.phdrsi._M_current = *(Elf64_Phdr **)((long)&pbVar22->field_2 + 8);
              __begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppPVar2;
            }
            else {
              __end2.phdrs = (ProgramHeaders *)paVar24->_M_allocated_capacity;
            }
            __end2.object = (Object *)pbVar22->_M_string_length;
            (pbVar22->_M_dataplus)._M_p = (pointer)paVar24;
            pbVar22->_M_string_length = 0;
            (pbVar22->field_2)._M_local_buf[0] = '\0';
            Context::getDebugImage
                      ((Context *)
                       &__end2.io.
                        super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(string *)pCVar4);
            _Var14 = __end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
            __end2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (this->debugObject).
                     super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
            (this->debugObject).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)_Var14._M_pi;
            (this->debugObject).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 uStack_a0._M_t.super___uniq_ptr_impl<debuginfod_client,_pstack::Context::DidClose>.
                 _M_t.super__Tuple_impl<0UL,_debuginfod_client_*,_pstack::Context::DidClose>.
                 super__Head_base<0UL,_debuginfod_client_*,_false>._M_head_impl;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (__begin2.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppPVar2) {
              operator_delete(__begin2.io.
                              super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,
                              (ulong)((long)&((__end2.phdrs)->
                                             super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if ((size_type *)
                buildID.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != &__str._M_string_length) {
              operator_delete(buildID.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                              __str._M_string_length + 1);
            }
            if (local_128 != (undefined1  [8])&__begin2.phdrs) {
              operator_delete((void *)local_128,
                              (ulong)((long)&((__begin2.phdrs)->
                                             super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if (local_2b0 != (undefined1  [8])&stack0xfffffffffffffd60) {
              operator_delete((void *)local_2b0,local_2a0 + 1);
            }
          }
        }
        pCVar4 = this->context;
        if ((this->debugObject).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          if (1 < pCVar4->verbose) {
            poVar20 = pCVar4->debug;
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"no debug object for ",0x14);
            peVar5 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar5->_vptr_Reader[5])(peVar5,poVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          }
          pOVar26 = (Object *)0x0;
        }
        else {
          if (1 < pCVar4->verbose) {
            poVar20 = pCVar4->debug;
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"found debug object ",0x13);
            peVar5 = (((this->debugObject).
                       super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
            (*peVar5->_vptr_Reader[5])(peVar5,poVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," for ",5);
            peVar5 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar5->_vptr_Reader[5])(peVar5,poVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          }
          local_2b0 = (undefined1  [8])&stack0xfffffffffffffd60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,".dynamic","");
          pSVar18 = getSection(this,(string *)local_2b0,0);
          if (local_2b0 != (undefined1  [8])&stack0xfffffffffffffd60) {
            operator_delete((void *)local_2b0,local_2a0 + 1);
          }
          pOVar26 = (this->debugObject).
                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_2b0 = (undefined1  [8])&stack0xfffffffffffffd60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,".dynamic","");
          pSVar19 = getSection(pOVar26,(string *)local_2b0,0);
          if (local_2b0 != (undefined1  [8])&stack0xfffffffffffffd60) {
            operator_delete((void *)local_2b0,local_2a0 + 1);
          }
          lVar27 = (pSVar18->shdr).sh_addr - (pSVar19->shdr).sh_addr;
          if ((lVar27 != 0) && (this->context->debug != (ostream *)0x0)) {
            poVar20 = this->context->debug;
            IOFlagSave::IOFlagSave
                      ((IOFlagSave *)local_2b0,
                       (ios *)(poVar20 + *(long *)(*(long *)poVar20 + -0x18)));
            poVar20 = this->context->debug;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar20,"warning: dynamic section for debug symbols ",0x2b);
            peVar5 = (((this->debugObject).
                       super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
            (*peVar5->_vptr_Reader[5])(peVar5,poVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," loaded for object ",0x13);
            peVar5 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar5->_vptr_Reader[5])(peVar5,poVar20);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar20," at different offset: diff is ",0x1e);
            *(uint *)(poVar20 + *(long *)(*(long *)poVar20 + -0x18) + 0x18) =
                 *(uint *)(poVar20 + *(long *)(*(long *)poVar20 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", assuming ",0xb);
            peVar5 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar5->_vptr_Reader[5])(peVar5,poVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," is prelinked",0xd);
            lVar6 = *(long *)poVar20;
            lVar7 = *(long *)(lVar6 + -0x18);
            *(uint *)(poVar20 + lVar7 + 0x18) = *(uint *)(poVar20 + lVar7 + 0x18) & 0xffffffb5 | 2;
            std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar20);
            std::ostream::put((char)poVar20);
            std::ostream::flush();
            peVar8 = (this->debugObject).
                     super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            puVar9 = (peVar8->sectionHeaders).
                     super__Vector_base<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar21 = (peVar8->sectionHeaders).
                           super__Vector_base<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar9;
                puVar21 = puVar21 + 1) {
              plVar1 = (long *)((long)(puVar21->_M_t).
                                      super___uniq_ptr_impl<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_pstack::Elf::Section_*,_std::default_delete<pstack::Elf::Section>_>
                                      .super__Head_base<0UL,_pstack::Elf::Section_*,_false> + 0x48);
              *plVar1 = *plVar1 + lVar27;
            }
            for (p_Var23 = (peVar8->programHeaders)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left;
                (_Rb_tree_header *)p_Var23 !=
                &(peVar8->programHeaders)._M_t._M_impl.super__Rb_tree_header;
                p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
              p_Var10 = p_Var23[1]._M_left;
              for (p_Var25 = p_Var23[1]._M_parent; p_Var25 != p_Var10;
                  p_Var25 = (_Base_ptr)&p_Var25[1]._M_right) {
                p_Var25->_M_left = (_Base_ptr)((long)p_Var25->_M_left + lVar27);
              }
            }
            IOFlagSave::~IOFlagSave((IOFlagSave *)local_2b0);
            this = (Object *)
                   io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
          }
          pOVar26 = (this->debugObject).
                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        if (auStack_68 == (undefined1  [8])0x0) {
          return pOVar26;
        }
        operator_delete((void *)auStack_68,
                        (long)buildID.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
        return pOVar26;
      }
    }
    else if (local_2b0 != (undefined1  [8])&stack0xfffffffffffffd60) {
      operator_delete((void *)local_2b0,local_2a0 + 1);
    }
    if (__str.field_2._M_allocated_capacity != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str.field_2._M_allocated_capacity
                );
    }
    Notes::iterator::operator++((iterator *)local_128);
  } while( true );
}

Assistant:

Object *
Object::getDebug() const
{
    if (debugLoaded || context.options.noExtDebug)
        return debugObject.get();
    debugLoaded = true;

    // Use the build ID to find debug data.
    std::vector<unsigned char> buildID;
    for (const auto &note : notes()) {
        if (note.name() == "GNU" && note.type() == GNU_BUILD_ID) {
            std::ostringstream dir;
            dir << ".build-id/";
            size_t i;
            auto io = note.data();
            buildID.resize(io->size());
            io->readObj(0, &buildID[0], io->size());
            dir << std::hex << std::setw(2) << std::setfill('0') << int(buildID[0]);
            dir << "/";
            for (i = 1; i < size_t(io->size()); ++i)
                dir << std::setw(2) << int(buildID[i]);
            dir << ".debug" << std::dec;
            debugObject = context.getDebugImage(dir.str());
            break;
        }
    }

    // If that doesn't work, maybe the gnu_debuglink is valid?
    if (!debugObject) {
        // if we have a debug link, use that to attempt to find the debug file.
        auto &hdr = getSection(".gnu_debuglink", SHT_PROGBITS);
        if (hdr) {
            auto link = hdr.io()->readString(0);
            auto dir = context.dirname(stringify(*io));
            debugObject = context.getDebugImage(dir + "/" + link); //
        }
    }

#ifdef DEBUGINFOD
   if (!debugObject && buildID.size() && context.debuginfod) {
      char *path;
      int fd = debuginfod_find_debuginfo(
            context.debuginfod.get(),
            buildID.data(),
            int( buildID.size() ),
            &path );
      if (fd >= 0) {
         std::shared_ptr<Reader> reader = std::make_shared<FileReader>(context, path, fd );
         reader = std::make_shared<CacheReader>(reader);
         debugObject = std::make_shared<Elf::Object>( context, reader, true );
         free(path);
      } else if (context.verbose) {
         *context.debug << "failed to fetch debuginfo with debuginfod: " << strerror(-fd) << "\n";
      }
   }
#endif

    if (!debugObject) {
        if (context.verbose >= 2)
           *context.debug << "no debug object for " << *this->io << "\n";
        return nullptr;
    }

    if (context.verbose >= 2)
        *context.debug << "found debug object " << *debugObject->io << " for " << *io << "\n";

    // Validate that the .dynamic section in the debug object and the one in
    // the original image have the same .sh_addr.
    auto &s = getSection(".dynamic", SHT_NULL);
    auto &d = debugObject->getSection(".dynamic", SHT_NULL);

    if (d.shdr.sh_addr != s.shdr.sh_addr && context.debug) {
        Elf::Addr diff = s.shdr.sh_addr - d.shdr.sh_addr;
        IOFlagSave _(*context.debug);
        *context.debug << "warning: dynamic section for debug symbols "
           << *debugObject->io << " loaded for object "
           << *this->io << " at different offset: diff is "
           << std::hex << diff
           << ", assuming " << *this->io << " is prelinked" << std::dec << std::endl;

        // looks like the exe has been prelinked - adjust the debug info too.
        for (auto &sect : debugObject->sectionHeaders)
            sect->shdr.sh_addr += diff;

        for (auto &sectType : debugObject->programHeaders)
            for (auto &sect : sectType.second)
                sect.p_vaddr += diff;
    }
    return debugObject.get();
}